

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrate_baseline.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ostream *poVar1;
  int th;
  double h;
  int local_4c;
  double local_48;
  double local_40;
  function<double_(double)> local_38;
  
  parse_arg(argc,argv,&local_40,&local_4c);
  std::chrono::_V2::system_clock::now();
  *(undefined8 *)(strtol + *(long *)(std::cout + -0x18)) = 0xf;
  local_38.super__Function_base._M_functor._8_8_ = 0;
  local_38.super__Function_base._M_functor._M_unused._M_object = y;
  local_38._M_invoker = std::_Function_handler<double_(double),_double_(*)(double)>::_M_invoke;
  local_38.super__Function_base._M_manager =
       std::_Function_handler<double_(double),_double_(*)(double)>::_M_manager;
  local_48 = integrate(&local_38,-2.99,0.0,local_40,local_4c);
  if (local_38.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_38.super__Function_base._M_manager)
              ((_Any_data *)&local_38,(_Any_data *)&local_38,__destroy_functor);
  }
  poVar1 = std::ostream::_M_insert<double>(local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
  poVar1 = std::ostream::_M_insert<double>(local_48 + -1.59530474926);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")\n\t",3);
  std::chrono::_V2::system_clock::now();
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ms",3);
  return 0;
}

Assistant:

int main(int argc, char *argv[]){
  double h;
  int th;
  try{
    parse_arg(argc, argv, h, th);
  }catch(std::runtime_error &err){
    std::cerr << err.what();
    return -1;
  }
  auto t = std::chrono::high_resolution_clock::now();
  std::cout.precision(15);
  auto res = integrate(y, -2.99, 0, h, th);
  std::cout << res << "(" << (res - 1.59530474926)  <<")\n\t";
  std::cout << std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::high_resolution_clock::now() - t).count() <<" ms";
}